

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void update_end_of_frame_stats(AV1_COMP *cpi)

{
  long *in_RDI;
  loopfilter *lf;
  AV1_COMMON *cm;
  
  if (((*(byte *)(in_RDI + 0x13aba) & 1) != 0) && ((int)in_RDI[0x782d] == 0)) {
    *(int *)(*in_RDI + 0x14c) = (int)in_RDI[0x8330];
    *(undefined4 *)(*in_RDI + 0x150) = *(undefined4 *)((long)in_RDI + 0x41984);
    *(int *)(*in_RDI + 0x154) = (int)in_RDI[0x8331];
    *(undefined4 *)(*in_RDI + 0x158) = *(undefined4 *)((long)in_RDI + 0x4198c);
  }
  memcpy((void *)(*in_RDI + 0x12360),in_RDI + 0x13aaf,0x4c);
  return;
}

Assistant:

static void update_end_of_frame_stats(AV1_COMP *cpi) {
  if (cpi->do_frame_data_update) {
    // Store current frame loopfilter levels in ppi, if update flag is set.
    if (!cpi->common.show_existing_frame) {
      AV1_COMMON *const cm = &cpi->common;
      struct loopfilter *const lf = &cm->lf;
      cpi->ppi->filter_level[0] = lf->backup_filter_level[0];
      cpi->ppi->filter_level[1] = lf->backup_filter_level[1];
      cpi->ppi->filter_level_u = lf->backup_filter_level_u;
      cpi->ppi->filter_level_v = lf->backup_filter_level_v;
    }
  }
  // Store frame level mv_stats from cpi to ppi.
  cpi->ppi->mv_stats = cpi->mv_stats;
}